

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tools.h
# Opt level: O2

void Tools::
     prune_container<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,std::back_insert_iterator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
               (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                begin,__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      end,
               __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> index_begin,
               __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> index_end,
               back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               inserter)

{
  long lVar1;
  value_type *__x;
  
  for (lVar1 = 0; __x = (value_type *)((long)&((begin._M_current)->_M_dataplus)._M_p + lVar1),
      __x != end._M_current; lVar1 = lVar1 + 0x20) {
    if ((index_begin._M_current == index_end._M_current) ||
       (lVar1 >> 5 != (long)*index_begin._M_current)) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(inserter.container,__x);
    }
    else {
      index_begin._M_current = index_begin._M_current + 1;
    }
  }
  return;
}

Assistant:

static void prune_container(Iterator begin, Iterator end, IndexIterator index_begin, IndexIterator index_end,
            OutputIterator inserter) {
        auto front = begin;
        for (; begin!=end; begin++) {
            if (index_begin == index_end) {
                (*inserter++) = (*begin);
            }
            else if (std::distance(front, begin)==(*index_begin)) {
                index_begin++;
            }
            else {
                (*inserter++) = (*begin);
            }
        }
    }